

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>::val
          (value_type *__return_storage_ptr__,
          FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>
          *this)

{
  double dVar1;
  double *pdVar2;
  int i;
  long lVar3;
  long lVar4;
  value_type local_38;
  
  FadBinaryMul<Fad<Fad<double>_>,_FadCst<double>_>::val(&local_38,&this->left_->fadexpr_);
  dVar1 = (this->right_).constant_;
  __return_storage_ptr__->val_ = local_38.val_ * dVar1;
  lVar4 = (long)local_38.dx_.num_elts;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if (lVar4 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = local_38.dx_.num_elts;
    pdVar2 = (double *)operator_new__(lVar4 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar2;
    __return_storage_ptr__->defaultVal = 0.0;
    if (0 < local_38.dx_.num_elts) {
      pdVar2 = (__return_storage_ptr__->dx_).ptr_to_data;
      lVar3 = 0;
      do {
        pdVar2[lVar3] = local_38.dx_.ptr_to_data[lVar3] * dVar1;
        lVar3 = lVar3 + 1;
      } while (lVar4 != lVar3);
    }
  }
  Fad<double>::~Fad(&local_38);
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}